

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pty.c
# Opt level: O3

void cleanup_utmp(void)

{
  timeval tv;
  timeval local_28;
  
  if (pty_stamped_utmp == '\x01') {
    utmp_entry.ut_type = 8;
    utmp_entry.ut_user[0] = '\0';
    utmp_entry.ut_user[1] = '\0';
    utmp_entry.ut_user[2] = '\0';
    utmp_entry.ut_user[3] = '\0';
    utmp_entry.ut_user[4] = '\0';
    utmp_entry.ut_user[5] = '\0';
    utmp_entry.ut_user[6] = '\0';
    utmp_entry.ut_user[7] = '\0';
    utmp_entry.ut_user[8] = '\0';
    utmp_entry.ut_user[9] = '\0';
    utmp_entry.ut_user[10] = '\0';
    utmp_entry.ut_user[0xb] = '\0';
    utmp_entry.ut_user[0xc] = '\0';
    utmp_entry.ut_user[0xd] = '\0';
    utmp_entry.ut_user[0xe] = '\0';
    utmp_entry.ut_user[0xf] = '\0';
    utmp_entry.ut_user[0x10] = '\0';
    utmp_entry.ut_user[0x11] = '\0';
    utmp_entry.ut_user[0x12] = '\0';
    utmp_entry.ut_user[0x13] = '\0';
    utmp_entry.ut_user[0x14] = '\0';
    utmp_entry.ut_user[0x15] = '\0';
    utmp_entry.ut_user[0x16] = '\0';
    utmp_entry.ut_user[0x17] = '\0';
    utmp_entry.ut_user[0x18] = '\0';
    utmp_entry.ut_user[0x19] = '\0';
    utmp_entry.ut_user[0x1a] = '\0';
    utmp_entry.ut_user[0x1b] = '\0';
    utmp_entry.ut_user[0x1c] = '\0';
    utmp_entry.ut_user[0x1d] = '\0';
    utmp_entry.ut_user[0x1e] = '\0';
    utmp_entry.ut_user[0x1f] = '\0';
    gettimeofday(&local_28,(__timezone_ptr_t)0x0);
    updwtmpx("/var/log/wtmp",(utmpx *)&utmp_entry);
    utmp_entry.ut_line[0x10] = '\0';
    utmp_entry.ut_line[0x11] = '\0';
    utmp_entry.ut_line[0x12] = '\0';
    utmp_entry.ut_line[0x13] = '\0';
    utmp_entry.ut_line[0x14] = '\0';
    utmp_entry.ut_line[0x15] = '\0';
    utmp_entry.ut_line[0x16] = '\0';
    utmp_entry.ut_line[0x17] = '\0';
    utmp_entry.ut_line[0x18] = '\0';
    utmp_entry.ut_line[0x19] = '\0';
    utmp_entry.ut_line[0x1a] = '\0';
    utmp_entry.ut_line[0x1b] = '\0';
    utmp_entry.ut_line[0x1c] = '\0';
    utmp_entry.ut_line[0x1d] = '\0';
    utmp_entry.ut_line[0x1e] = '\0';
    utmp_entry.ut_line[0x1f] = '\0';
    utmp_entry.ut_line[0] = '\0';
    utmp_entry.ut_line[1] = '\0';
    utmp_entry.ut_line[2] = '\0';
    utmp_entry.ut_line[3] = '\0';
    utmp_entry.ut_line[4] = '\0';
    utmp_entry.ut_line[5] = '\0';
    utmp_entry.ut_line[6] = '\0';
    utmp_entry.ut_line[7] = '\0';
    utmp_entry.ut_line[8] = '\0';
    utmp_entry.ut_line[9] = '\0';
    utmp_entry.ut_line[10] = '\0';
    utmp_entry.ut_line[0xb] = '\0';
    utmp_entry.ut_line[0xc] = '\0';
    utmp_entry.ut_line[0xd] = '\0';
    utmp_entry.ut_line[0xe] = '\0';
    utmp_entry.ut_line[0xf] = '\0';
    utmp_entry.ut_tv.tv_sec = 0;
    utmp_entry.ut_tv.tv_usec = 0;
    setutxent();
    pututxline((utmpx *)&utmp_entry);
    endutxent();
    pty_stamped_utmp = '\0';
  }
  return;
}

Assistant:

static void cleanup_utmp(void)
{
    struct timeval tv;

    if (!pty_stamped_utmp)
        return;

    utmp_entry.ut_type = DEAD_PROCESS;
    memset(utmp_entry.ut_user, 0, lenof(utmp_entry.ut_user));
    gettimeofday(&tv, NULL);
    utmp_entry.ut_tv.tv_sec = tv.tv_sec;
    utmp_entry.ut_tv.tv_usec = tv.tv_usec;

#if HAVE_UPDWTMPX
    updwtmpx(WTMPX_FILE, &utmp_entry);
#endif

    memset(utmp_entry.ut_line, 0, lenof(utmp_entry.ut_line));
    utmp_entry.ut_tv.tv_sec = 0;
    utmp_entry.ut_tv.tv_usec = 0;

    setutxent();
    pututxline(&utmp_entry);
    endutxent();

    pty_stamped_utmp = false;     /* ensure we never double-cleanup */
}